

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O1

bool __thiscall jbcoin::STBitString<128UL>::isEquivalent(STBitString<128UL> *this,STBase *t)

{
  long lVar1;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STBase_002d84d0) {
    return false;
  }
  lVar1 = 0;
  do {
    if (*(char *)((long)(this->value_).pn + lVar1) != *(char *)((long)&t[1]._vptr_STBase + lVar1))
    goto LAB_001ed707;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  lVar1 = 0x10;
LAB_001ed707:
  return lVar1 == 0x10;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        const STBitString* v = dynamic_cast<const STBitString*> (&t);
        return v && (value_ == v->value_);
    }